

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

IHEVCD_ERROR_T ihevcd_parse_buffering_period_sei(codec_t *ps_codec,sps_t *ps_sps)

{
  bitstrm_t *ps_bitstrm;
  byte bVar1;
  UWORD8 UVar2;
  UWORD32 UVar3;
  long lVar4;
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  (ps_codec->s_parse).s_sei_params.i1_buf_period_params_present_flag = '\x01';
  UVar3 = ihevcd_uev(ps_bitstrm);
  (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u1_bp_seq_parameter_set_id =
       (UWORD8)UVar3;
  if ((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_sub_pic_cpb_params_present_flag == '\0') {
    UVar3 = ihevcd_bits_get(ps_bitstrm,1);
    UVar2 = (UWORD8)UVar3;
    (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u1_rap_cpb_params_present_flag = UVar2;
  }
  else {
    UVar2 = (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u1_rap_cpb_params_present_flag;
  }
  if (UVar2 == '\0') {
    (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u4_cpb_delay_offset = 0;
    UVar3 = 0;
  }
  else {
    UVar3 = ihevcd_bits_get(ps_bitstrm,
                            (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                            u1_au_cpb_removal_delay_length_minus1 + 1);
    (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u4_cpb_delay_offset = UVar3;
    UVar3 = ihevcd_bits_get(ps_bitstrm,
                            (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                            u1_dpb_output_delay_length_minus1 + 1);
  }
  (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u4_dpb_delay_offset = UVar3;
  UVar3 = ihevcd_bits_get(ps_bitstrm,1);
  (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u1_concatenation_flag = (UWORD8)UVar3;
  UVar3 = ihevcd_bits_get(ps_bitstrm,
                          (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                          u1_au_cpb_removal_delay_length_minus1 + 1);
  (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u4_au_cpb_removal_delay_delta_minus1 =
       UVar3;
  if ((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_nal_hrd_parameters_present_flag != '\0') {
    bVar1 = (ps_sps->s_vui_parameters).s_vui_hrd_parameters.au1_cpb_cnt_minus1[0];
    lVar4 = 0;
    do {
      UVar3 = ihevcd_bits_get(ps_bitstrm,
                              (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                              u1_initial_cpb_removal_delay_length_minus1 + 1);
      (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.au4_nal_initial_cpb_removal_delay
      [lVar4] = UVar3;
      UVar3 = ihevcd_bits_get(ps_bitstrm,
                              (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                              u1_initial_cpb_removal_delay_length_minus1 + 1);
      (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.
      au4_nal_initial_cpb_removal_delay_offset[lVar4] = UVar3;
      if (((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_sub_pic_cpb_params_present_flag !=
           '\0') ||
         ((ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u1_rap_cpb_params_present_flag !=
          '\0')) {
        UVar3 = ihevcd_bits_get(ps_bitstrm,
                                (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                                u1_initial_cpb_removal_delay_length_minus1 + 1);
        (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.
        au4_nal_initial_alt_cpb_removal_delay[lVar4] = UVar3;
        UVar3 = ihevcd_bits_get(ps_bitstrm,
                                (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                                u1_initial_cpb_removal_delay_length_minus1 + 1);
        (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.
        au4_nal_initial_alt_cpb_removal_delay_offset[lVar4] = UVar3;
      }
      lVar4 = lVar4 + 1;
    } while ((ulong)bVar1 + 1 != lVar4);
  }
  if ((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_vcl_hrd_parameters_present_flag != '\0') {
    bVar1 = (ps_sps->s_vui_parameters).s_vui_hrd_parameters.au1_cpb_cnt_minus1[0];
    lVar4 = 0;
    do {
      UVar3 = ihevcd_bits_get(ps_bitstrm,
                              (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                              u1_initial_cpb_removal_delay_length_minus1 + 1);
      (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.au4_vcl_initial_cpb_removal_delay
      [lVar4] = UVar3;
      UVar3 = ihevcd_bits_get(ps_bitstrm,
                              (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                              u1_initial_cpb_removal_delay_length_minus1 + 1);
      (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.
      au4_vcl_initial_cpb_removal_delay_offset[lVar4] = UVar3;
      if (((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_sub_pic_cpb_params_present_flag !=
           '\0') ||
         ((ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.u1_rap_cpb_params_present_flag !=
          '\0')) {
        UVar3 = ihevcd_bits_get(ps_bitstrm,
                                (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                                u1_initial_cpb_removal_delay_length_minus1 + 1);
        (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.
        au4_vcl_initial_alt_cpb_removal_delay[lVar4] = UVar3;
        UVar3 = ihevcd_bits_get(ps_bitstrm,
                                (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                                u1_initial_cpb_removal_delay_length_minus1 + 1);
        (ps_codec->s_parse).s_sei_params.s_buf_period_sei_params.
        au4_vcl_initial_alt_cpb_removal_delay_offset[lVar4] = UVar3;
      }
      lVar4 = lVar4 + 1;
    } while ((ulong)bVar1 + 1 != lVar4);
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_buffering_period_sei(codec_t *ps_codec,
                                                 sps_t *ps_sps)
{
    parse_ctxt_t *ps_parse = &ps_codec->s_parse;
    bitstrm_t *ps_bitstrm = &ps_parse->s_bitstrm;
    UWORD32 value;
    vui_t *ps_vui;
    buf_period_sei_params_t *ps_buf_period_sei_params;
    UWORD32 i;
    hrd_params_t *ps_vui_hdr;
    UWORD32 u4_cpb_cnt;

    ps_vui = &ps_sps->s_vui_parameters;
    ps_vui_hdr = &ps_vui->s_vui_hrd_parameters;

    ps_buf_period_sei_params = &ps_parse->s_sei_params.s_buf_period_sei_params;

    ps_parse->s_sei_params.i1_buf_period_params_present_flag = 1;

    UEV_PARSE("bp_seq_parameter_set_id", value, ps_bitstrm);
    ps_buf_period_sei_params->u1_bp_seq_parameter_set_id = value;

    if(!ps_vui_hdr->u1_sub_pic_cpb_params_present_flag)
    {
        BITS_PARSE("irap_cpb_params_present_flag", value, ps_bitstrm, 1);
        ps_buf_period_sei_params->u1_rap_cpb_params_present_flag = value;
    }

    if(ps_buf_period_sei_params->u1_rap_cpb_params_present_flag)
    {
        BITS_PARSE("cpb_delay_offset",
                   value,
                   ps_bitstrm,
                   (ps_vui_hdr->u1_au_cpb_removal_delay_length_minus1
                                   + 1));
        ps_buf_period_sei_params->u4_cpb_delay_offset = value;

        BITS_PARSE("dpb_delay_offset",
                   value,
                   ps_bitstrm,
                   (ps_vui_hdr->u1_dpb_output_delay_length_minus1
                                   + 1));
        ps_buf_period_sei_params->u4_dpb_delay_offset = value;
    }
    else
    {
        ps_buf_period_sei_params->u4_cpb_delay_offset = 0;
        ps_buf_period_sei_params->u4_dpb_delay_offset = 0;
    }

    BITS_PARSE("concatenation_flag", value, ps_bitstrm, 1);
    ps_buf_period_sei_params->u1_concatenation_flag = value;

    BITS_PARSE("au_cpb_removal_delay_delta_minus1",
               value,
               ps_bitstrm,
               (ps_vui_hdr->u1_au_cpb_removal_delay_length_minus1
                               + 1));
    ps_buf_period_sei_params->u4_au_cpb_removal_delay_delta_minus1 = value;

    if(ps_vui_hdr->u1_nal_hrd_parameters_present_flag)
    {
        u4_cpb_cnt = ps_vui_hdr->au1_cpb_cnt_minus1[0];

        for(i = 0; i <= u4_cpb_cnt; i++)
        {
            BITS_PARSE("nal_initial_cpb_removal_delay[i]",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_nal_initial_cpb_removal_delay[i] =
                            value;

            BITS_PARSE("nal_initial_cpb_removal_delay_offset",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_nal_initial_cpb_removal_delay_offset[i] =
                            value;

            if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag
                            || ps_buf_period_sei_params->u1_rap_cpb_params_present_flag)
            {
                BITS_PARSE("nal_initial_alt_cpb_removal_delay[i]",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_nal_initial_alt_cpb_removal_delay[i] =
                                value;

                BITS_PARSE("nal_initial_alt_cpb_removal_delay_offset",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_nal_initial_alt_cpb_removal_delay_offset[i] =
                                value;
            }
        }
    }

    if(ps_vui_hdr->u1_vcl_hrd_parameters_present_flag)
    {
        u4_cpb_cnt = ps_vui_hdr->au1_cpb_cnt_minus1[0];

        for(i = 0; i <= u4_cpb_cnt; i++)
        {
            BITS_PARSE("vcl_initial_cpb_removal_delay[i]",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_vcl_initial_cpb_removal_delay[i] =
                            value;

            BITS_PARSE("vcl_initial_cpb_removal_delay_offset",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_vcl_initial_cpb_removal_delay_offset[i] =
                            value;

            if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag
                            || ps_buf_period_sei_params->u1_rap_cpb_params_present_flag)
            {
                BITS_PARSE("vcl_initial_alt_cpb_removal_delay[i]",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_vcl_initial_alt_cpb_removal_delay[i] =
                                value;

                BITS_PARSE("vcl_initial_alt_cpb_removal_delay_offset",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_vcl_initial_alt_cpb_removal_delay_offset[i] =
                                value;
            }
        }
    }

    return (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
}